

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<15>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  int *piVar1;
  int *piVar2;
  int i;
  int index;
  RepeatedField<int> *array;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32_t *)((long)field + 0x10),output)
    ;
    for (index = 0; index < *field; index = index + 1) {
      piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)field,index);
      piVar1 = (int *)output->ptr;
      *piVar1 = *piVar2;
      output->ptr = (uint8_t *)(piVar1 + 1);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}